

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O0

void __thiscall
hanabi_learning_env::HanabiHand::RemoveFromHand
          (HanabiHand *this,int card_index,
          vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
          *discard_pile)

{
  value_type *in_RDX;
  int in_ESI;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *in_RDI;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<const_hanabi_learning_env::HanabiCard_*,_std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>_>
  *in_stack_ffffffffffffff90;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *this_00
  ;
  value_type *in_stack_ffffffffffffff98;
  const_iterator in_stack_ffffffffffffffa8;
  
  if (in_RDX != (value_type *)0x0) {
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    operator[](in_RDI,(long)in_ESI);
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    push_back(in_RDI,in_RDX);
    in_stack_ffffffffffffff98 = in_RDX;
  }
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  begin(in_stack_ffffffffffffff88);
  __gnu_cxx::
  __normal_iterator<hanabi_learning_env::HanabiCard_*,_std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>_>
  ::operator+((__normal_iterator<hanabi_learning_env::HanabiCard_*,_std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>_>
               *)in_stack_ffffffffffffff98,(difference_type)in_stack_ffffffffffffff90);
  __gnu_cxx::
  __normal_iterator<hanabi_learning_env::HanabiCard_const*,std::vector<hanabi_learning_env::HanabiCard,std::allocator<hanabi_learning_env::HanabiCard>>>
  ::__normal_iterator<hanabi_learning_env::HanabiCard*>
            (in_stack_ffffffffffffff90,
             (__normal_iterator<hanabi_learning_env::HanabiCard_*,_std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>_>
              *)in_stack_ffffffffffffff88);
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  erase(in_RDI,(const_iterator)in_stack_ffffffffffffffa8._M_current);
  this_00 = in_RDI + 1;
  std::
  vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ::begin((vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
           *)in_stack_ffffffffffffff88);
  __gnu_cxx::
  __normal_iterator<hanabi_learning_env::HanabiHand::CardKnowledge_*,_std::vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>_>
  ::operator+((__normal_iterator<hanabi_learning_env::HanabiHand::CardKnowledge_*,_std::vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>_>
               *)in_stack_ffffffffffffff98,(difference_type)this_00);
  __gnu_cxx::
  __normal_iterator<hanabi_learning_env::HanabiHand::CardKnowledge_const*,std::vector<hanabi_learning_env::HanabiHand::CardKnowledge,std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>>>
  ::__normal_iterator<hanabi_learning_env::HanabiHand::CardKnowledge*>
            ((__normal_iterator<const_hanabi_learning_env::HanabiHand::CardKnowledge_*,_std::vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>_>
              *)this_00,
             (__normal_iterator<hanabi_learning_env::HanabiHand::CardKnowledge_*,_std::vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>_>
              *)in_stack_ffffffffffffff88);
  std::
  vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ::erase((vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
           *)in_RDI,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void HanabiHand::RemoveFromHand(int card_index,
                                std::vector<HanabiCard>* discard_pile) {
  if (discard_pile != nullptr) {
    discard_pile->push_back(cards_[card_index]);
  }
  cards_.erase(cards_.begin() + card_index);
  card_knowledge_.erase(card_knowledge_.begin() + card_index);
}